

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O3

ImVec2_Simple igGetMousePosOnOpeningCurrentPopup_nonUDT2(void)

{
  ImVec2 IVar1;
  
  IVar1 = ImGui::GetMousePosOnOpeningCurrentPopup();
  return (ImVec2_Simple)IVar1;
}

Assistant:

CIMGUI_API ImVec2_Simple *_igGetMousePosOnOpeningCurrentPopup_nonUDT2 () {
  ImVec2_Simple * lresult = (ImVec2_Simple *)0 ;
  ImVec2_Simple result;
  
  try {
    result = igGetMousePosOnOpeningCurrentPopup_nonUDT2();
    lresult = new ImVec2_Simple(result);
    return lresult;
  } catch (...) {
    return (ImVec2_Simple *)0;
  }
}